

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O1

uint sstep(re_guts *g,sopno start,sopno stop,uint bef,int ch,uint aft)

{
  sop *psVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (start != stop) {
    uVar8 = 1 << ((byte)start & 0x1f);
    psVar1 = g->strip;
    do {
      uVar4 = psVar1[start];
      uVar3 = (uint)uVar4;
      bVar2 = (byte)uVar4;
      uVar7 = bef;
      switch((ulong)(uVar3 & 0x7c000000) - 0x4000000 >> 0x1a) {
      case 0:
        if (start != stop + -1) {
          __assert_fail("pc == stop-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x344,"unsigned int sstep()");
        }
        break;
      case 1:
        if ((char)bVar2 == ch) goto LAB_001086c0;
        break;
      case 2:
        if ((ch & 0xfffffffdU) == 0x81) goto LAB_001086c0;
        break;
      case 3:
        if ((ch & 0xfffffffeU) == 0x82) goto LAB_001086c0;
        break;
      case 4:
        if (ch < 0x80) goto LAB_001086c0;
        break;
      case 5:
        if ((ch < 0x80) &&
           (uVar4 = (ulong)((uVar3 & 0x3ffffff) << 5),
           (*(byte *)(*(long *)((long)&g->sets->ptr + uVar4) + ((ulong)(uint)ch & 0xff)) &
           (&g->sets->mask)[uVar4]) != 0)) goto LAB_001086c0;
        break;
      case 6:
      case 7:
      case 8:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x11:
        uVar7 = aft;
LAB_001086c0:
        aft = aft | (uVar8 & uVar7) * 2;
        break;
      case 9:
        uVar6 = uVar8 >> (bVar2 & 0x1f);
        uVar7 = (aft & uVar8) * 2 | aft;
        aft = (uVar7 & uVar8) >> (bVar2 & 0x1f) | uVar7;
        if (((uVar6 & uVar7) == 0) && ((uVar6 & aft) != 0)) {
          start = start + ~(ulong)(uVar3 & 0x3ffffff);
          uVar8 = 1 << ((byte)start & 0x1f);
        }
        break;
      case 0xe:
        uVar4 = (ulong)(uVar3 & 0x3ffffff);
        if ((*(uint *)(psVar1 + start + (ulong)(uVar3 & 0x3ffffff)) & 0x7c000000) != 0x44000000) {
          __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,899,"unsigned int sstep()");
        }
      case 10:
        uVar7 = (aft & uVar8) * 2 | aft;
        aft = (uVar7 & uVar8) << ((byte)uVar4 & 0x1f);
LAB_001085af:
        aft = aft | uVar7;
        break;
      case 0xf:
        if ((aft & uVar8) != 0) {
          lVar5 = 1;
          while( true ) {
            uVar7 = (uint)psVar1[start + lVar5] & 0x7c000000;
            if (uVar7 != 0x44000000) break;
            lVar5 = lVar5 + (ulong)((uint)psVar1[start + lVar5] & 0x3ffffff);
          }
          if (uVar7 != 0x48000000) {
            __assert_fail("OP(s) == OOR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0x38b,"unsigned int sstep()");
          }
          aft = aft | (aft & uVar8) << ((byte)lVar5 & 0x1f);
        }
        break;
      case 0x10:
        aft = aft | (aft & uVar8) * 2;
        uVar7 = (uint)psVar1[start + (ulong)(uVar3 & 0x3ffffff)] & 0x7c000000;
        if (uVar7 != 0x44000000) {
          if (uVar7 != 0x48000000) {
            __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0x392,"unsigned int sstep()");
          }
          break;
        }
        uVar7 = (aft & uVar8) << ((byte)(uVar3 & 0x3ffffff) & 0x1f);
        goto LAB_001085af;
      case 0x12:
        if (ch == 0x85) goto LAB_001086c0;
        break;
      case 0x13:
        if (ch == 0x86) goto LAB_001086c0;
        break;
      default:
        __assert_fail("nope",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x39a,"unsigned int sstep()");
      }
      start = start + 1;
      uVar8 = uVar8 * 2;
    } while (start != stop);
  }
  return aft;
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
states aft;		/* states already known reachable after */
{
	cset *cs;
	sop s;
	sopno pc;
	onestate here;		/* note, macros know this name */
	sopno look;
	long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}